

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O2

bool __thiscall Indexing::ClauseCodeTree::LiteralMatcher::next(LiteralMatcher *this)

{
  CodeOp **ppCVar1;
  bool bVar2;
  
  if (this->_eagerlyMatched == true) {
    ppCVar1 = (this->eagerResults)._cursor;
    bVar2 = ppCVar1 != (this->eagerResults)._stack;
    (this->super_Matcher)._matched = bVar2;
    if (bVar2) {
      (this->eagerResults)._cursor = ppCVar1 + -1;
      (this->super_Matcher).super_BaseMatcher.op = ppCVar1[-1];
      return true;
    }
  }
  else if (((this->super_Matcher)._fresh != false) || (((this->super_Matcher)._matched & 1U) != 0))
  {
    bVar2 = CodeTree::Matcher::execute(&this->super_Matcher);
    (this->super_Matcher)._matched = bVar2;
    if (bVar2) {
      if ((((this->super_Matcher).super_BaseMatcher.op)->_content & 7) != 2) {
        return true;
      }
      recordMatch(this);
      return true;
    }
  }
  return false;
}

Assistant:

bool ClauseCodeTree::LiteralMatcher::next()
{
  if(eagerlyMatched()) {
    _matched=!eagerResults.isEmpty();
    if(!_matched) {
      return false;
    }
    op=eagerResults.pop();
    return true;
  }

  if(finished()) {
    //all possible matches are exhausted
    return false;
  }

  _matched=execute();
  if(!_matched) {
    return false;
  }

  ASS(op->isLitEnd() || op->isSuccess());
  if(op->isLitEnd()) {
    recordMatch();
  }
  return true;
}